

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.cpp
# Opt level: O0

void __thiscall
TasGrid::GridLocalPolynomial::getQuadratureWeights(GridLocalPolynomial *this,double *weights)

{
  double *weights_local;
  GridLocalPolynomial *this_local;
  
  switch(this->effective_rule) {
  case pwc:
    getQuadratureWeights<(TasGrid::RuleLocal::erule)0>(this,weights);
    break;
  case localp:
    getQuadratureWeights<(TasGrid::RuleLocal::erule)1>(this,weights);
    break;
  case semilocalp:
    getQuadratureWeights<(TasGrid::RuleLocal::erule)2>(this,weights);
    break;
  case localp0:
    getQuadratureWeights<(TasGrid::RuleLocal::erule)3>(this,weights);
    break;
  default:
    getQuadratureWeights<(TasGrid::RuleLocal::erule)4>(this,weights);
  }
  return;
}

Assistant:

void GridLocalPolynomial::getQuadratureWeights(double *weights) const{
    switch(effective_rule) {
        case RuleLocal::erule::pwc:
            getQuadratureWeights<RuleLocal::erule::pwc>(weights);
            break;
        case RuleLocal::erule::localp:
            getQuadratureWeights<RuleLocal::erule::localp>(weights);
            break;
        case RuleLocal::erule::semilocalp:
            getQuadratureWeights<RuleLocal::erule::semilocalp>(weights);
            break;
        case RuleLocal::erule::localp0:
            getQuadratureWeights<RuleLocal::erule::localp0>(weights);
            break;
        default: // case RuleLocal::erule::localpb:
            getQuadratureWeights<RuleLocal::erule::localpb>(weights);
            break;
    };
}